

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

int utils::mkdir(char *__path,__mode_t __mode)

{
  bool bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  istream *piVar5;
  char *path;
  string local_240 [39];
  allocator local_219;
  string local_218 [32];
  stringstream local_1f8 [8];
  stringstream ss;
  string local_70 [8];
  string dirName;
  allocator local_39;
  string local_38 [8];
  string currentPath;
  char *path_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::string(local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,__path,&local_219);
  _Var3 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1f8,local_218,_Var3);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  do {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1f8,local_70,'/');
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    if (!bVar1) {
      path_local._4_4_ = 0;
LAB_001045de:
      std::__cxx11::stringstream::~stringstream(local_1f8);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_38);
      return path_local._4_4_;
    }
    std::__cxx11::string::operator+=(local_38,local_70);
    std::__cxx11::string::string(local_240,local_38);
    bVar2 = dirExists((string *)local_240);
    bVar1 = false;
    if (!bVar2) {
      path = (char *)std::__cxx11::string::c_str();
      iVar4 = _mkdir(path);
      bVar1 = iVar4 != 0;
    }
    std::__cxx11::string::~string(local_240);
    if (bVar1) {
      path_local._4_4_ = -1;
      goto LAB_001045de;
    }
    std::__cxx11::string::operator+=(local_38,"/");
  } while( true );
}

Assistant:

static inline int mkdir(const char *path) {
  std::string currentPath = "";
  std::string dirName;
  std::stringstream ss(path);

  while (std::getline(ss, dirName, '/')) {
    currentPath += dirName;
    if (!dirExists(currentPath) && _mkdir(currentPath.c_str()) != 0) {
      return -1;
    }
    currentPath += "/";
  }
  return 0;
}